

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
kj::ArrayBuilder<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>::
truncate(ArrayBuilder<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>
         *this,char *__file,__off_t __length)

{
  long lVar1;
  ulong uVar2;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  
  lVar1 = *(long *)this;
  while (uVar2 = *(ulong *)(this + 8), (ulong)((long)__file * 0x28 + lVar1) < uVar2) {
    *(ulong *)(this + 8) = uVar2 - 0x28;
    ArrayBuilder<capnp::_::RawSchema_*>::dispose
              ((ArrayBuilder<capnp::_::RawSchema_*> *)(uVar2 - 0x20));
    in_RAX = extraout_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }